

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O1

void __thiscall
la::LevenshteinDFA::Search
          (LevenshteinDFA *this,trie_tree *trie,int start,trie_node *node,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  size_t *psVar1;
  map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
  *this_00;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  trie_node *ptVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  long *******ppppppplVar5;
  _Node *p_Var6;
  iterator iVar7;
  _List_node_base *p_Var8;
  mapped_type *pmVar9;
  long *******ppppppplVar10;
  mapped_type *pmVar11;
  bool bVar12;
  _List_node_base *p_Var13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  int i;
  long lVar17;
  int i_1;
  pair<int,_char> pair;
  list<char,_std::allocator<char>_> inputs;
  int local_7c;
  LevenshteinDFA *local_78;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  trie_tree *local_68;
  key_type local_60;
  _Base_ptr local_58;
  _List_node_base *local_50;
  long *******local_48;
  long *******local_40;
  long local_38;
  
  for (p_Var13 = (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next;
      (p_Var13 != (_List_node_base *)&this->_finalStates && (*(int *)&p_Var13[1]._M_next != start));
      p_Var13 = p_Var13->_M_next) {
  }
  local_7c = start;
  local_78 = this;
  local_70 = output;
  local_68 = trie;
  if ((p_Var13 != (_List_node_base *)&this->_finalStates) && (node->_is_end_word == true)) {
    p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output,
                        &node->_value);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    psVar1 = &(output->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  local_38 = 0;
  local_50 = (_List_node_base *)&local_78->_uniqueChars;
  p_Var13 = (local_78->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl._M_node.
            super__List_node_base._M_next;
  local_48 = (long *******)&local_48;
  local_40 = (long *******)&local_48;
  if (p_Var13 != local_50) {
    this_00 = &local_78->_transTable;
    local_58 = &(local_78->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_60.second = *(char *)&p_Var13[1]._M_next;
      local_60.first = local_7c;
      iVar7 = std::
              _Rb_tree<std::pair<int,_char>,_std::pair<const_std::pair<int,_char>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_char>,_int>_>,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
              ::find(&this_00->_M_t,&local_60);
      if (iVar7._M_node != local_58) {
        p_Var8 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var8[1]._M_next = *(undefined1 *)&p_Var13[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        local_38 = local_38 + 1;
        lVar17 = 0;
        do {
          ptVar2 = (node->_children)._M_elems[lVar17];
          if ((ptVar2 != (trie_node *)0x0) && (ptVar2->_key == *(char *)&p_Var13[1]._M_next)) {
            pmVar9 = std::
                     map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
                     ::at(this_00,&local_60);
            Search(local_78,local_68,*pmVar9,(node->_children)._M_elems[lVar17],local_70);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x28);
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != local_50);
  }
  uVar3 = (local_78->_defaultTrans)._M_h._M_bucket_count;
  uVar14 = (ulong)(long)local_7c % uVar3;
  p_Var15 = (local_78->_defaultTrans)._M_h._M_buckets[uVar14];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var15->_M_nxt, p_Var16 = p_Var15, local_7c != *(int *)&p_Var15->_M_nxt[1]._M_nxt))
  {
    while (p_Var15 = p_Var4, p_Var4 = p_Var15->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var4[1]._M_nxt % uVar3 != uVar14) ||
         (p_Var16 = p_Var15, local_7c == *(int *)&p_Var4[1]._M_nxt)) goto LAB_00107061;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_00107061:
  ppppppplVar10 = local_48;
  if ((p_Var16 != (__node_base_ptr)0x0) && (p_Var16->_M_nxt != (_Hash_node_base *)0x0)) {
    this_01 = &local_78->_defaultTrans;
    lVar17 = 0;
    do {
      ptVar2 = (node->_children)._M_elems[lVar17];
      if (ptVar2 != (trie_node *)0x0) {
        if ((long ********)local_48 != &local_48) {
          bVar12 = false;
          ppppppplVar10 = local_48;
          do {
            if (*(char *)(ppppppplVar10 + 2) == ptVar2->_key) {
              bVar12 = true;
            }
            ppppppplVar10 = (long *******)*ppppppplVar10;
          } while ((long ********)ppppppplVar10 != &local_48);
          if (bVar12) goto LAB_001070d8;
        }
        pmVar11 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this_01,&local_7c);
        Search(local_78,local_68,*pmVar11,(node->_children)._M_elems[lVar17],local_70);
      }
LAB_001070d8:
      lVar17 = lVar17 + 1;
      ppppppplVar10 = local_48;
    } while (lVar17 != 0x28);
  }
  while ((long ********)ppppppplVar10 != &local_48) {
    ppppppplVar5 = (long *******)*ppppppplVar10;
    operator_delete(ppppppplVar10,0x18);
    ppppppplVar10 = ppppppplVar5;
  }
  return;
}

Assistant:

void LevenshteinDFA::Search(const trie_tree &trie, int start, trie_node * node, std::list<std::string> &output)
    {
        /**/
        if (std::find(_finalStates.begin(), _finalStates.end(), start) != _finalStates.end() &&node->_is_end_word )
        {
            output.emplace_back(node->_value);
        }
        std::list<char> inputs;
        for (std::list<char>::iterator it = _uniqueChars.begin(); it != _uniqueChars.end();++it)
        {
            std::pair<int, char> pair = std::make_pair(start, *it);
            auto it2 = _transTable.find(pair);
            if (it2 != _transTable.end())
            {
                inputs.emplace_back(*it);
                for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
                {
                    if (node->_children[i] == NULL)
                        continue;
                    if (node->_children[i]->_key == *it)
                    {
                        Search(trie, _transTable.at(pair), node->_children[i], output);
                    }
                }
            }
        }
        auto it = _defaultTrans.find(start);
        if (it != _defaultTrans.end())
        {
            for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
            {
                bool found = false;;
                if (node->_children[i] == NULL) continue;
                for (std::list<char>::iterator it = inputs.begin(); it != inputs.end();++it)
                {
                    if (*it == node->_children[i]->_key)
                    {
                        found = true;
                    }
                }
                if (!found)
                {
                    Search(trie, _defaultTrans.at(start), node->_children[i], output);
                }
            }
        }

    }